

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * addBddDoInterval(DdManager *dd,DdNode *f,DdNode *l,DdNode *u)

{
  DdHalfWord index;
  DdNode *T_00;
  DdNode *pDVar1;
  DdNode *local_78;
  DdNode *local_70;
  bool local_5d;
  int v;
  DdNode *fvn;
  DdNode *fv;
  DdNode *E;
  DdNode *T;
  DdNode *res;
  DdNode *u_local;
  DdNode *l_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    local_5d = true;
    if ((l->type).value <= (f->type).value) {
      local_5d = (u->type).value <= (f->type).value && (f->type).value != (u->type).value;
    }
    dd_local = (DdManager *)((ulong)dd->one ^ (long)(int)(uint)local_5d);
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup(dd,0x22,f,l,u);
    if (dd_local == (DdManager *)0x0) {
      index = f->index;
      pDVar1 = (f->type).kids.E;
      T_00 = addBddDoInterval(dd,(f->type).kids.T,l,u);
      if (T_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        pDVar1 = addBddDoInterval(dd,pDVar1,l,u);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)T_00 & 1) == 0) {
            local_78 = T_00;
            if (T_00 != pDVar1) {
              local_78 = cuddUniqueInter(dd,index,T_00,pDVar1);
            }
            T = local_78;
            if (local_78 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
          }
          else {
            if (T_00 == pDVar1) {
              local_70 = (DdNode *)((ulong)T_00 ^ 1);
            }
            else {
              local_70 = cuddUniqueInter(dd,index,(DdNode *)((ulong)T_00 ^ 1),
                                         (DdNode *)((ulong)pDVar1 ^ 1));
            }
            if (local_70 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
            T = (DdNode *)((ulong)local_70 ^ 1);
          }
          *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert(dd,0x22,f,l,u,T);
          dd_local = (DdManager *)T;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addBddDoInterval(
  DdManager * dd,
  DdNode * f,
  DdNode * l,
  DdNode * u)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        return(Cudd_NotCond(DD_ONE(dd),cuddV(f) < cuddV(l) || cuddV(f) > cuddV(u)));
    }

    /* Check cache. */
    res = cuddCacheLookup(dd,DD_ADD_BDD_DO_INTERVAL_TAG,f,l,u);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoInterval(dd,fv,l,u);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoInterval(dd,fvn,l,u);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert(dd,DD_ADD_BDD_DO_INTERVAL_TAG,f,l,u,res);

    return(res);

}